

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

ConstraintBlockSyntax * __thiscall
slang::parsing::Parser::parseConstraintBlock(Parser *this,bool isTopLevel)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  int iVar3;
  Diagnostic *this_00;
  SourceLocation SVar4;
  undefined4 extraout_var;
  ConstraintBlockSyntax *pCVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  Token TVar9;
  SourceRange range;
  string_view arg;
  Token openBrace;
  ConstraintItemSyntax *member;
  Token closeBrace;
  SmallVector<slang::syntax::ConstraintItemSyntax_*,_8UL> members;
  SyntaxNode *local_d0;
  Token local_c8;
  Token local_b8;
  Info *local_a8;
  undefined8 local_a0;
  Token *local_98;
  Token *local_90;
  SyntaxList<slang::syntax::ConstraintItemSyntax> local_88;
  
  Token::Token(&local_c8);
  TVar9 = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  local_88.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&local_88.super_SyntaxListBase.super_SyntaxNode.previewNode;
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
  local_88.super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x8;
  local_90 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_98 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar6 = false;
  while( true ) {
    local_a8 = TVar9.info;
    local_a0 = TVar9._0_8_;
    TVar9 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar9.kind == EndOfFile) || ((TVar9._0_4_ & 0xffff) == 0xe)) break;
    local_d0 = &parseConstraintItem(this,false,isTopLevel)->super_SyntaxNode;
    bVar8 = local_d0 == (SyntaxNode *)0x0;
    if (bVar8) {
      bVar2 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar9.kind);
      if (bVar2) {
        local_b8 = ParserBase::peek(&this->super_ParserBase);
        range = Token::range(&local_b8);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
        local_b8 = ParserBase::peek(&this->super_ParserBase);
        arg = Token::valueText(&local_b8);
        Diagnostic::operator<<(this_00,arg);
        bVar7 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           (bVar7 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar4 = Token::location(local_90);
          Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar4);
          SVar4 = Token::location(local_98);
          Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar4);
          bVar7 = 0;
        }
      }
      else {
        bVar7 = ~bVar6 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar7 << 0x20 | 0x450005));
    }
    else {
      checkMemberAllowed(this,local_d0,ConstraintBlock);
      SmallVectorBase<slang::syntax::ConstraintItemSyntax*>::
      emplace_back<slang::syntax::ConstraintItemSyntax*const&>
                ((SmallVectorBase<slang::syntax::ConstraintItemSyntax*> *)&local_88,
                 (ConstraintItemSyntax **)&local_d0);
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      local_d0->previewNode = pSVar1;
    }
    TVar9.info = local_a8;
    TVar9.kind = (undefined2)local_a0;
    TVar9._2_1_ = local_a0._2_1_;
    TVar9.numFlags.raw = local_a0._3_1_;
    TVar9.rawLen = local_a0._4_4_;
    bVar6 = bVar8;
  }
  local_c8 = ParserBase::expect(&this->super_ParserBase,CloseBrace);
  iVar3 = SmallVectorBase<slang::syntax::ConstraintItemSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::ConstraintItemSyntax_*> *)&local_88,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_c8.info);
  local_88.super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var,iVar3);
  if ((SyntaxNode **)local_88.super_SyntaxListBase._vptr_SyntaxListBase !=
      &local_88.super_SyntaxListBase.super_SyntaxNode.previewNode) {
    operator_delete(local_88.super_SyntaxListBase._vptr_SyntaxListBase);
  }
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005db530;
  openBrace.info = local_a8;
  openBrace.kind = (undefined2)local_a0;
  openBrace._2_1_ = local_a0._2_1_;
  openBrace.numFlags.raw = local_a0._3_1_;
  openBrace.rawLen = local_a0._4_4_;
  pCVar5 = slang::syntax::SyntaxFactory::constraintBlock
                     (&this->factory,openBrace,&local_88,local_c8);
  return pCVar5;
}

Assistant:

ConstraintBlockSyntax& Parser::parseConstraintBlock(bool isTopLevel) {
    Token closeBrace;
    auto openBrace = expect(TokenKind::OpenBrace);
    auto members = parseMemberList<ConstraintItemSyntax>(
        TokenKind::CloseBrace, closeBrace, SyntaxKind::ConstraintBlock,
        [this, isTopLevel](SyntaxKind, bool&) { return parseConstraintItem(false, isTopLevel); });

    return factory.constraintBlock(openBrace, members, closeBrace);
}